

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinDeserializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
     deserialize_elems<InputStream>(undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  resize(param_1,param_2);
  deserialize_elems_noinsert<InputStream>(param_1,param_2,param_3);
  return;
}

Assistant:

static void deserialize_elems(
    std::false_type  /* no insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    resize(has_resize<Sequence>{}, s, size);

    deserialize_elems_noinsert(
      is_sequence_batch_deserializable<Sequence>{},
      is_proxy_sequence<Sequence>{},
      s, size, istream
    );
  }